

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_new_output(lyd_node *parent,lys_module *module,char *name)

{
  lys_node *name_00;
  char *mod;
  int iVar1;
  LY_ERR *pLVar2;
  lys_node *siblings_00;
  size_t sVar3;
  lys_node *siblings;
  lys_node *snode;
  char *name_local;
  lys_module *module_local;
  lyd_node *parent_local;
  
  siblings = (lys_node *)0x0;
  snode = (lys_node *)name;
  name_local = (char *)module;
  module_local = (lys_module *)parent;
  if (((parent == (lyd_node *)0x0) && (module == (lys_module *)0x0)) || (name == (char *)0x0)) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    parent_local = (lyd_node *)0x0;
  }
  else {
    siblings_00 = lyd_new_find_schema(parent,module,1);
    mod = name_local;
    name_00 = snode;
    if (siblings_00 == (lys_node *)0x0) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINVAL;
      parent_local = (lyd_node *)0x0;
    }
    else {
      sVar3 = strlen((char *)snode);
      iVar1 = lys_get_data_sibling
                        ((lys_module *)mod,siblings_00,(char *)name_00,(int)sVar3,
                         LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER,&siblings);
      if ((iVar1 == 0) && (siblings != (lys_node *)0x0)) {
        parent_local = _lyd_new((lyd_node *)module_local,siblings,0);
      }
      else {
        parent_local = (lyd_node *)0x0;
      }
    }
  }
  return parent_local;
}

Assistant:

lyd_node *
lyd_new_output(struct lyd_node *parent, const struct lys_module *module, const char *name)
{
    const struct lys_node *snode = NULL, *siblings;

    if ((!parent && !module) || !name) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    siblings = lyd_new_find_schema(parent, module, 1);
    if (!siblings) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (lys_get_data_sibling(module, siblings, name, strlen(name), LYS_CONTAINER | LYS_LIST | LYS_NOTIF | LYS_RPC | LYS_ACTION, &snode)
            || !snode) {
        return NULL;
    }

    return _lyd_new(parent, snode, 0);
}